

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrExternalCameraExtrinsicsOCULUS *value)

{
  bool bVar1;
  undefined7 in_register_00000009;
  XrResult XVar2;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  uint32_t in_stack_fffffffffffffddc;
  allocator local_219;
  string local_218;
  string local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1d8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c0;
  ostringstream oss_enum;
  
  XVar2 = XR_SUCCESS;
  if ((int)CONCAT71(in_register_00000009,check_members) != 0) {
    if (value->cameraStatusFlags < 0x20) {
      std::__cxx11::string::string
                ((string *)&oss_enum,"XrExternalCameraExtrinsicsOCULUS",(allocator *)&local_1f8);
      std::__cxx11::string::string((string *)&local_218,"attachedToDevice",&local_219);
      bVar1 = ValidateXrEnum(instance_info,command_name,(string *)&oss_enum,&local_218,objects_info,
                             value->attachedToDevice);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&oss_enum);
      if (bVar1) {
        return XR_SUCCESS;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enum);
      std::operator<<((ostream *)&oss_enum,
                      "XrExternalCameraExtrinsicsOCULUS contains invalid XrExternalCameraAttachedToDeviceOCULUS \"attachedToDevice\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffddc);
      std::operator<<((ostream *)&oss_enum,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::string
                ((string *)&local_218,
                 "VUID-XrExternalCameraExtrinsicsOCULUS-attachedToDevice-parameter",&local_219);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1d8,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_218,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1d8,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      this = &local_1d8;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_enum);
      std::operator<<((ostream *)&oss_enum,
                      "XrExternalCameraExtrinsicsOCULUS invalid member XrExternalCameraStatusFlagsOCULUS \"cameraStatusFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_(in_stack_fffffffffffffddc);
      std::operator<<((ostream *)&oss_enum,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::operator<<((ostream *)&oss_enum," contains illegal bit");
      std::__cxx11::string::string
                ((string *)&local_218,
                 "VUID-XrExternalCameraExtrinsicsOCULUS-cameraStatusFlags-parameter",&local_219);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c0,objects_info);
      std::__cxx11::stringbuf::str();
      CoreValidLogMessage(instance_info,&local_218,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c0,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      this = &local_1c0;
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_enum);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrExternalCameraExtrinsicsOCULUS* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult external_camera_status_flags_oculus_result = ValidateXrExternalCameraStatusFlagsOCULUS(value->cameraStatusFlags);
    // Valid flags available, so it must be invalid to fail.
    if (VALIDATE_XR_FLAGS_INVALID == external_camera_status_flags_oculus_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrExternalCameraExtrinsicsOCULUS invalid member XrExternalCameraStatusFlagsOCULUS \"cameraStatusFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->cameraStatusFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraExtrinsicsOCULUS-cameraStatusFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrExternalCameraAttachedToDeviceOCULUS value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrExternalCameraExtrinsicsOCULUS", "attachedToDevice", objects_info, value->attachedToDevice)) {
        std::ostringstream oss_enum;
        oss_enum << "XrExternalCameraExtrinsicsOCULUS contains invalid XrExternalCameraAttachedToDeviceOCULUS \"attachedToDevice\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->attachedToDevice));
        CoreValidLogMessage(instance_info, "VUID-XrExternalCameraExtrinsicsOCULUS-attachedToDevice-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}